

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void __thiscall
cubeb_passthrough_resampler_fill_short_input_Test::TestBody
          (cubeb_passthrough_resampler_fill_short_input_Test *this)

{
  uint32_t i;
  long lVar1;
  char *pcVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  AssertionResult gtest_ar;
  long output_frame_count;
  long input_frame_count;
  AssertHelper local_270;
  long got;
  passthrough_resampler<float> resampler;
  float input [64];
  float output [64];
  
  passthrough_resampler<float>::passthrough_resampler
            (&resampler,(cubeb_stream *)0x0,passthrough_resampler_fill_short_input,(void *)0x0,2,
             0xac44);
  input_frame_count = 0x10;
  output_frame_count = 0x20;
  memset(input,0,0x100);
  memset(output,0,0x100);
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    input[lVar1] = (float)(int)lVar1 * 0.01;
  }
  got = passthrough_resampler<float>::fill(&resampler,input,&input_frame_count,output,0x20);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"got","output_frame_count",&got,&output_frame_count);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_298);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x3cd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_270,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_298);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_298.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (output_frame_count + -0x10);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&gtest_ar,"input_frame_count","output_frame_count - 16",
               &input_frame_count,(long *)&local_298);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_298);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_270,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x3cf,pcVar2);
      testing::internal::AssertHelper::operator=(&local_270,(Message *)&local_298);
      testing::internal::AssertHelper::~AssertHelper(&local_270);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_298);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  passthrough_resampler<float>::~passthrough_resampler(&resampler);
  return;
}

Assistant:

TEST(cubeb, passthrough_resampler_fill_short_input) {
  uint32_t channels = 2;
  uint32_t sample_rate = 44100;
  passthrough_resampler<float> resampler =
    passthrough_resampler<float>(nullptr, passthrough_resampler_fill_short_input,
                                 nullptr, channels, sample_rate);

  long input_frame_count = 16;
  long output_frame_count = 32;
  float input[64] = {};
  float output[64] = {};
  for (uint32_t i = 0; i < input_frame_count * channels; ++i) {
    input[i] = 0.01 * i;
  }
  long got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used are less than the output frames due to glitch.
  ASSERT_EQ(input_frame_count, output_frame_count - 16);
}